

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr,int *pRc)

{
  int iVar1;
  sqlite3_vtab *psVar2;
  Fts3DeferredToken *pFVar3;
  Fts3PhraseToken *pFVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uchar *z;
  Fts3DeferredToken **ppFVar8;
  long lVar9;
  long lVar10;
  Fts3DeferredToken **ppFVar11;
  bool bVar12;
  int rc;
  int local_8c;
  int local_88;
  int nToken;
  Fts3Cursor *local_80;
  int iDum2;
  int iDum1;
  int *local_70;
  long local_68;
  sqlite3_tokenizer_cursor *pTC;
  sqlite3_module *local_58;
  sqlite3_tokenizer_cursor *local_50;
  sqlite3_int64 local_48;
  long local_40;
  char *zToken;
  
  rc = *pRc;
  if (rc != 0) {
    return 0;
  }
  ppFVar11 = &pCsr->pDeferred;
  iVar6 = 0;
  if (pCsr->pDeferred != (Fts3DeferredToken *)0x0) {
    rc = fts3CursorSeek((sqlite3_context *)0x0,pCsr);
    iVar6 = rc;
    if ((rc == 0) && (iVar6 = 0, *ppFVar11 != (Fts3DeferredToken *)0x0)) {
      psVar2 = (pCsr->base).pVtab;
      local_58 = psVar2[3].pModule;
      local_68 = *(long *)&local_58->iVersion;
      iVar6 = 0;
      local_80 = pCsr;
      local_70 = pRc;
      local_48 = sqlite3_column_int64(pCsr->pStmt,0);
      lVar9 = 0;
      do {
        pRc = local_70;
        pCsr = local_80;
        bVar12 = iVar6 == 0;
        while( true ) {
          lVar10 = lVar9;
          lVar9 = lVar10 + 1;
          ppFVar8 = ppFVar11;
          if ((!bVar12) || (local_40 = lVar10, *(int *)&psVar2[2].pModule <= lVar10))
          goto LAB_001bbb6d;
          if (psVar2[2].zErrMsg[lVar10] == '\0') break;
          bVar12 = true;
        }
        z = sqlite3_column_text(local_80->pStmt,(int)lVar9);
        pTC = (sqlite3_tokenizer_cursor *)0x0;
        iVar6 = sqlite3Fts3OpenTokenizer
                          ((sqlite3_tokenizer *)local_58,pCsr->iLangid,(char *)z,-1,&pTC);
        local_50 = pTC;
        while (iVar6 == 0) {
          nToken = 0;
          iDum1 = 0;
          iDum2 = 0;
          local_88 = 0;
          iVar6 = (**(code **)(local_68 + 0x28))(local_50,&zToken,&nToken,&iDum1,&iDum2,&local_88);
          ppFVar8 = ppFVar11;
          local_8c = iVar6;
          while ((iVar5 = local_88, pFVar3 = *ppFVar8, pFVar3 != (Fts3DeferredToken *)0x0 &&
                 (iVar6 == 0))) {
            pFVar4 = pFVar3->pToken;
            iVar7 = 0;
            iVar6 = 0;
            if (((lVar9 - (ulong)(uint)pFVar3->iCol == 1) ||
                (*(int *)&psVar2[2].pModule <= pFVar3->iCol)) &&
               (local_88 == 0 || pFVar4->bFirst == 0)) {
              iVar1 = pFVar4->n;
              iVar6 = iVar7;
              if (((iVar1 == nToken) || ((iVar1 < nToken && (pFVar4->isPrefix != 0)))) &&
                 (iVar7 = bcmp(zToken,pFVar4->z,(long)iVar1), iVar7 == 0)) {
                fts3PendingListAppend(&pFVar3->pList,local_48,local_40,(long)iVar5,&local_8c);
                iVar6 = local_8c;
              }
            }
            ppFVar8 = &pFVar3->pNext;
          }
        }
        if (local_50 != (sqlite3_tokenizer_cursor *)0x0) {
          (**(code **)(local_68 + 0x20))(local_50);
        }
        if (iVar6 == 0x65) {
          local_8c = 0;
          iVar6 = 0;
        }
      } while( true );
    }
  }
LAB_001bbb9f:
  rc = iVar6;
  iVar6 = fts3EvalTestExpr(pCsr,pCsr->pExpr,&rc);
  while (pFVar3 = *ppFVar11, pFVar3 != (Fts3DeferredToken *)0x0) {
    sqlite3_free(pFVar3->pList);
    pFVar3->pList = (PendingList *)0x0;
    ppFVar11 = &pFVar3->pNext;
  }
  *pRc = rc;
  return (uint)(iVar6 == 0 && rc == 0);
LAB_001bbb6d:
  while ((pFVar3 = *ppFVar8, pFVar3 != (Fts3DeferredToken *)0x0 && (iVar6 == 0))) {
    if (pFVar3->pList == (PendingList *)0x0) {
      iVar6 = 0;
    }
    else {
      iVar6 = fts3PendingListAppendVarint(&pFVar3->pList,0);
    }
    ppFVar8 = &pFVar3->pNext;
  }
  goto LAB_001bbb9f;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalTestDeferred(Fts3Cursor *pCsr, int *pRc){
  int rc = *pRc;
  int bMiss = 0;
  if( rc==SQLITE_OK ){

    /* If there are one or more deferred tokens, load the current row into
    ** memory and scan it to determine the position list for each deferred
    ** token. Then, see if this row is really a match, considering deferred
    ** tokens and NEAR operators (neither of which were taken into account
    ** earlier, by fts3EvalNextRow()). 
    */
    if( pCsr->pDeferred ){
      rc = fts3CursorSeek(0, pCsr);
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts3CacheDeferredDoclists(pCsr);
      }
    }
    bMiss = (0==fts3EvalTestExpr(pCsr, pCsr->pExpr, &rc));

    /* Free the position-lists accumulated for each deferred token above. */
    sqlite3Fts3FreeDeferredDoclists(pCsr);
    *pRc = rc;
  }
  return (rc==SQLITE_OK && bMiss);
}